

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseables.cpp
# Opt level: O0

char * anon_unknown.dwarf_8326cb::NthArg(char *arg,int n)

{
  int local_18;
  int x;
  int n_local;
  char *arg_local;
  
  _x = arg;
  for (local_18 = 0; local_18 < n && _x != (char *)0x0; local_18 = local_18 + 1) {
    _x = FindEndOfArg(_x);
    if (_x != (char *)0x0) {
      _x = _x + 1;
    }
  }
  return _x;
}

Assistant:

inline const char* NthArg(const char* arg, int n)
{
    for (int x=0; x<n && arg; ++x)
        if ((arg = FindEndOfArg(arg)) != nullptr)
            ++arg;  // skip arg separator

    return arg;
}